

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O1

void __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>::
set_computed_output_rate
          (LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false> *this,
          float cycles_per_second,int buffer_size,bool param_3)

{
  float fVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->filter_parameters_mutex_);
  if (iVar2 == 0) {
    fVar1 = (this->filter_parameters_).output_cycles_per_second;
    if (((fVar1 != cycles_per_second) || (NAN(fVar1) || NAN(cycles_per_second))) ||
       ((long)(this->output_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->output_buffer_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_start >> 1 != (long)buffer_size)) {
      (this->filter_parameters_).output_cycles_per_second = cycles_per_second;
      (this->filter_parameters_).parameters_are_dirty = true;
      std::vector<short,_std::allocator<short>_>::resize(&this->output_buffer_,(long)buffer_size);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->filter_parameters_mutex_);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void set_computed_output_rate(float cycles_per_second, int buffer_size, bool) final {
			std::lock_guard lock_guard(filter_parameters_mutex_);
			if(filter_parameters_.output_cycles_per_second == cycles_per_second && size_t(buffer_size) == output_buffer_.size()) {
				return;
			}

			filter_parameters_.output_cycles_per_second = cycles_per_second;
			filter_parameters_.parameters_are_dirty = true;
			output_buffer_.resize(std::size_t(buffer_size) * (is_stereo + 1));
		}